

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.hpp
# Opt level: O0

Color __thiscall
PlasticBSDF::sample_f
          (PlasticBSDF *this,vec3f *wo,vec3f *wi,HitInfo *hit,bool *isDirac,Sampler *sampler)

{
  uint uVar1;
  long in_RCX;
  vec3f *in_RDX;
  vec3f *in_RSI;
  vec3f *in_RDI;
  float px;
  float fVar2;
  float pz;
  vec3f vVar3;
  Color CVar4;
  Color val;
  Type allowed;
  bool through;
  Color f0;
  float pdf;
  vec3f woL;
  vec3f wiL;
  vec3f N2;
  vec3f N1;
  vec3f *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  BSDF *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  float *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  float in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined8 local_148;
  float local_140;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  vec3f *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  vec3f local_70;
  vec3f local_64;
  vec3f local_58;
  vec3f local_4c [2];
  long local_30;
  vec3f *local_28;
  vec3f *local_20;
  float fVar5;
  
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  vec3f::vec3f(local_4c);
  vec3f::vec3f(&local_58);
  BSDF::getLocalBasis((vec3f *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      in_stack_fffffffffffffee8,
                      (vec3f *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  vec3f::vec3f(&local_64);
  px = dot(local_20,local_4c);
  fVar2 = dot(local_20,&local_58);
  pz = dot(local_20,(vec3f *)(local_30 + 0x10));
  vec3f::vec3f(&local_70,px,fVar2,pz);
  BSDF::albedo(in_stack_fffffffffffffe80,
               (vec2f *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  sample_f((PlasticBSDF *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
           (Color *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
           (vec3f *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
           (vec3f *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
           in_stack_fffffffffffffe90,
           (bool *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
           (Sampler *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  ::operator*(fVar2,in_stack_fffffffffffffe40);
  ::operator*(fVar2,in_stack_fffffffffffffe40);
  ::operator+(in_RDI,(vec3f *)CONCAT44(px,fVar2));
  ::operator*(fVar2,in_stack_fffffffffffffe40);
  vVar3 = ::operator+(in_RDI,(vec3f *)CONCAT44(px,fVar2));
  local_148 = vVar3._0_8_;
  local_140 = vVar3.z;
  local_28->x = (float)(undefined4)local_148;
  local_28->y = (float)local_148._4_4_;
  local_28->z = local_140;
  fVar2 = dot(local_20,(vec3f *)(local_30 + 0x1c));
  uVar1 = (uint)(0.0 < fVar2);
  fVar2 = dot(local_28,(vec3f *)(local_30 + 0x1c));
  if (uVar1 != 0.0 < fVar2) {
    vec3f::vec3f((vec3f *)&stack0xfffffffffffffea4,0.0);
  }
  vVar3 = operator/(in_RDI,px);
  CVar4.x = vVar3.x;
  CVar4.y = vVar3.y;
  register0x00001240 = vVar3.z;
  return CVar4;
}

Assistant:

Color sample_f(const vec3f& wo, vec3f& wi, const HitInfo& hit, bool& isDirac, Sampler& sampler) const
	{
		// generate sample
		vec3f N1,N2;
		getLocalBasis(hit.Ns, N1, N2);
		vec3f wiL, woL = vec3f(dot(wo,N1), dot(wo,N2), dot(wo,hit.Ns));
		float pdf;
		Color f0 = sample_f(albedo(hit.uv), woL, wiL, pdf, isDirac, sampler);
		wi = wiL.x * N1 + wiL.y * N2 + wiL.z * hit.Ns;
		// recalculate to make sure
		// Ng is used to determine whether BRDF or BTDF is used
		bool through = (dot(wo, hit.Ng)>0) ^ (dot(wi, hit.Ng)>0);
		BxDF::Type allowed = through? BxDF::TRANSMIT : BxDF::REFLECT;
		Color val = (BxDF::REFLECT & allowed)? f0: 0;
		return val / pdf;
	}